

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O2

MMDB_lookup_result_s *
MMDB_lookup_sockaddr
          (MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,sockaddr *sockaddr,
          int *mmdb_error)

{
  uint16_t uVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint uVar4;
  int iVar5;
  ushort uVar6;
  sa_family_t sVar7;
  ulong uVar8;
  uint8_t *puVar9;
  char *pcVar10;
  record_info_s local_68;
  uint8_t mapped_address [16];
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->entry).mmdb = (MMDB_s *)0x0;
  *(undefined8 *)&(__return_storage_ptr__->entry).offset = 0;
  *(undefined8 *)&__return_storage_ptr__->netmask = 0;
  (__return_storage_ptr__->entry).mmdb = mmdb;
  uVar1 = (mmdb->metadata).ip_version;
  sVar7 = sockaddr->sa_family;
  if (uVar1 == 4) {
    if (sVar7 == 10) {
      iVar5 = 0xb;
      goto LAB_0010337b;
    }
    pcVar10 = sockaddr->sa_data + 2;
  }
  else if (sVar7 == 10) {
    pcVar10 = sockaddr->sa_data + 6;
    sVar7 = 10;
  }
  else {
    pcVar10 = (char *)mapped_address;
    mapped_address[8] = '\0';
    mapped_address[9] = '\0';
    mapped_address[10] = '\0';
    mapped_address[0xb] = '\0';
    mapped_address[0] = '\0';
    mapped_address[1] = '\0';
    mapped_address[2] = '\0';
    mapped_address[3] = '\0';
    mapped_address[4] = '\0';
    mapped_address[5] = '\0';
    mapped_address[6] = '\0';
    mapped_address[7] = '\0';
    mapped_address._12_4_ = *(undefined4 *)(sockaddr->sa_data + 2);
  }
  record_info_for_database(&local_68,mmdb);
  if ((ulong)local_68.right_record_offset == 0) {
    iVar5 = 6;
  }
  else {
    if (sVar7 == 2 && uVar1 == 6) {
      uVar8 = (ulong)(mmdb->ipv4_start_node).node_value;
      uVar6 = (mmdb->ipv4_start_node).netmask;
    }
    else {
      uVar6 = 0;
      uVar8 = 0;
    }
    uVar2 = (mmdb->metadata).node_count;
    puVar3 = mmdb->file_content;
    while ((uVar6 < mmdb->depth && (uVar8 < uVar2))) {
      puVar9 = puVar3 + uVar8 * local_68.record_length;
      if (mmdb->data_section < puVar9 + local_68.record_length) {
        iVar5 = 2;
        goto LAB_0010337b;
      }
      if (((byte)pcVar10[uVar6 >> 3] >> (~(byte)uVar6 & 7) & 1) == 0) {
        uVar4 = (*local_68.left_record_getter)(puVar9);
      }
      else {
        uVar4 = (*local_68.right_record_getter)(puVar9 + local_68.right_record_offset);
      }
      uVar6 = uVar6 + 1;
      uVar8 = (ulong)uVar4;
    }
    __return_storage_ptr__->netmask = uVar6;
    iVar5 = 2;
    if (uVar8 < mmdb->data_section_size + uVar2) {
      if (uVar8 == uVar2) {
        __return_storage_ptr__->found_entry = false;
      }
      else {
        __return_storage_ptr__->found_entry = true;
        (__return_storage_ptr__->entry).offset = ((int)uVar8 - (mmdb->metadata).node_count) - 0x10;
      }
      iVar5 = 0;
    }
  }
LAB_0010337b:
  *mmdb_error = iVar5;
  return __return_storage_ptr__;
}

Assistant:

MMDB_lookup_result_s MMDB_lookup_sockaddr(const MMDB_s *const mmdb,
                                          const struct sockaddr *const sockaddr,
                                          int *const mmdb_error) {
    MMDB_lookup_result_s result = {.found_entry = false,
                                   .netmask = 0,
                                   .entry = {.mmdb = mmdb, .offset = 0}};

    uint8_t mapped_address[16];
    uint8_t const *address;
    if (mmdb->metadata.ip_version == 4) {
        if (sockaddr->sa_family == AF_INET6) {
            *mmdb_error = MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR;
            return result;
        }
        address = (uint8_t const *)&((struct sockaddr_in const *)sockaddr)
                      ->sin_addr.s_addr;
    } else {
        if (sockaddr->sa_family == AF_INET6) {
            address = (uint8_t const *)&((struct sockaddr_in6 const *)sockaddr)
                          ->sin6_addr.s6_addr;
        } else {
            address = mapped_address;
            memset(mapped_address, 0, 12);
            memcpy(mapped_address + 12,
                   &((struct sockaddr_in const *)sockaddr)->sin_addr.s_addr,
                   4);
        }
    }

    *mmdb_error = find_address_in_search_tree(
        mmdb, address, sockaddr->sa_family, &result);

    return result;
}